

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

void fe_short_to_frame(int16 *in,frame_t *out,int32 len)

{
  int local_20;
  int i;
  int32 len_local;
  frame_t *out_local;
  int16 *in_local;
  
  for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
    out[local_20] = (frame_t)(double)(int)in[local_20];
  }
  return;
}

Assistant:

static void
fe_short_to_frame(int16 const *in, frame_t * out, int32 len)
{
    int i;

#if defined(FIXED_POINT)
    for (i = 0; i < len; i++)
        out[i] = (int32) in[i] << DEFAULT_RADIX;
#else                           /* FIXED_POINT */
    for (i = 0; i < len; i++)
        out[i] = (frame_t) in[i];
#endif                          /* FIXED_POINT */
}